

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O0

wchar_t archive_acl_add_entry
                  (archive_acl *acl,wchar_t type,wchar_t permset,wchar_t tag,wchar_t id,char *name)

{
  wchar_t wVar1;
  archive_acl_entry *mbs;
  wchar_t in_ECX;
  wchar_t in_EDX;
  wchar_t in_ESI;
  archive_acl *in_RDI;
  wchar_t in_R8D;
  archive_mstring *in_R9;
  archive_acl_entry *ap;
  wchar_t local_4;
  
  wVar1 = acl_special(in_RDI,in_ESI,in_EDX,in_ECX);
  if (wVar1 == L'\0') {
    local_4 = L'\0';
  }
  else {
    mbs = acl_new_entry((archive_acl *)CONCAT44(in_ESI,in_EDX),in_ECX,in_R8D,
                        (wchar_t)((ulong)in_R9 >> 0x20),(wchar_t)in_R9);
    if (mbs == (archive_acl_entry *)0x0) {
      local_4 = L'\xffffffe7';
    }
    else {
      if ((in_R9 == (archive_mstring *)0x0) || (*(char *)&(in_R9->aes_mbs).s == '\0')) {
        archive_mstring_clean((archive_mstring *)0x2bcc2e);
      }
      else {
        archive_mstring_copy_mbs(in_R9,(char *)mbs);
      }
      local_4 = L'\0';
    }
  }
  return local_4;
}

Assistant:

int
archive_acl_add_entry(struct archive_acl *acl,
    int type, int permset, int tag, int id, const char *name)
{
	struct archive_acl_entry *ap;

	if (acl_special(acl, type, permset, tag) == 0)
		return ARCHIVE_OK;
	ap = acl_new_entry(acl, type, permset, tag, id);
	if (ap == NULL) {
		/* XXX Error XXX */
		return ARCHIVE_FAILED;
	}
	if (name != NULL  &&  *name != '\0')
		archive_mstring_copy_mbs(&ap->name, name);
	else
		archive_mstring_clean(&ap->name);
	return ARCHIVE_OK;
}